

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QStyleSheetStyle::renderMenuItemIcon
          (QStyleSheetStyle *this,QStyleOptionMenuItem *mi,QPainter *p,QWidget *w,QRect *rect,
          QRenderRule *subRule)

{
  long lVar1;
  qreal qVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  Int IVar6;
  int iVar7;
  QRenderRule *pQVar8;
  QStyleSheetGeometryData *pQVar9;
  undefined8 in_RCX;
  QPoint *in_RDX;
  long in_RSI;
  long *in_RDI;
  LayoutDirection in_R8D;
  long in_FS_OFFSET;
  int pixh;
  int pixw;
  int iconSize;
  bool checked;
  Mode mode;
  QRect pmr;
  QRect iconRect;
  QPixmap pixmap;
  QSize sz;
  QRenderRule iconRule;
  int in_stack_fffffffffffffe68;
  undefined4 uVar10;
  int aheight;
  StateFlag in_stack_fffffffffffffe6c;
  QRenderRule *in_stack_fffffffffffffe70;
  QRenderRule *this_00;
  QRect *in_stack_fffffffffffffe78;
  QRect *this_01;
  QStyleSheetGeometryData *in_stack_fffffffffffffe80;
  QRect *in_stack_fffffffffffffe90;
  QPixmap *this_02;
  int in_stack_fffffffffffffe9c;
  QRenderRule *in_stack_fffffffffffffea0;
  QWidget *w_00;
  QStyleSheetStyle *this_03;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QHash<QString,_QVariant> local_a0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_98;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_94;
  undefined1 local_90 [44];
  int in_stack_ffffffffffffff9c;
  QSharedDataPointer<QStyleSheetPaletteData> in_stack_ffffffffffffffa0;
  QSharedDataPointer<QStyleSheetBoxData> in_stack_ffffffffffffffa8;
  QSharedDataPointer<QStyleSheetBackgroundData> in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_94.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
  if (IVar6 != 0) {
    local_98.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                   );
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_98);
  }
  (**(code **)(*in_RDI + 0xe0))(in_RDI,0x3e,in_RSI,in_RCX);
  local_a0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
               in_stack_fffffffffffffe68);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (QRenderRule *)(in_RSI + 0x78);
  qVar2 = QStyleHelper::getDpr((QPainter *)0x4313ed);
  QIcon::pixmap((QSize *)&local_b8,qVar2,(Mode)pQVar8,(State)&local_a0);
  iVar7 = QPixmap::width();
  w_00 = (QWidget *)(double)iVar7;
  dVar3 = (double)QPixmap::devicePixelRatio();
  dVar3 = (double)w_00 / dVar3;
  iVar7 = QPixmap::height();
  this_03 = (QStyleSheetStyle *)(double)iVar7;
  dVar4 = (double)QPixmap::devicePixelRatio();
  iVar7 = (int)((double)this_03 / dVar4);
  memset(local_90,0xaa,0x88);
  renderRule((QStyleSheetStyle *)in_stack_ffffffffffffffb0.d.ptr,
             (QObject *)in_stack_ffffffffffffffa8.d.ptr,
             (QStyleOption *)in_stack_ffffffffffffffa0.d.ptr,in_stack_ffffffffffffff9c);
  bVar5 = QRenderRule::hasGeometry(in_stack_fffffffffffffe70);
  if (bVar5) {
    pQVar9 = QSharedDataPointer<QStyleSheetGeometryData>::operator->
                       ((QSharedDataPointer<QStyleSheetGeometryData> *)in_stack_fffffffffffffe70);
    pQVar9->width = (int)dVar3;
    pQVar9 = QSharedDataPointer<QStyleSheetGeometryData>::operator->
                       ((QSharedDataPointer<QStyleSheetGeometryData> *)in_stack_fffffffffffffe70);
    pQVar9->height = iVar7;
  }
  else {
    in_stack_fffffffffffffea0 = (QRenderRule *)operator_new(0x1c);
    uVar10 = 0xffffffff;
    QStyleSheetGeometryData::QStyleSheetGeometryData
              (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (int)in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (int)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
               (int)in_stack_fffffffffffffe90);
    QSharedDataPointer<QStyleSheetGeometryData>::operator=
              ((QSharedDataPointer<QStyleSheetGeometryData> *)in_stack_fffffffffffffe70,
               (QStyleSheetGeometryData *)CONCAT44(in_stack_fffffffffffffe6c,uVar10));
    iVar7 = in_stack_fffffffffffffe9c;
  }
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aheight = *(int *)(in_RSI + 0xc);
  local_c8 = (undefined1  [16])
             positionRect(this_03,w_00,pQVar8,in_stack_fffffffffffffea0,iVar7,
                          in_stack_fffffffffffffe90,in_R8D);
  if (*(int *)(in_RSI + 0xc) == 0) {
    QRect::left((QRect *)0x4315f4);
    QRect::moveLeft((QRect *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  else {
    QRect::right((QRect *)0x431612);
    QRect::moveRight((QRect *)in_stack_fffffffffffffe80,
                     (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  }
  pQVar8 = (QRenderRule *)local_90;
  this_00 = (QRenderRule *)local_c8;
  QRenderRule::drawRule(pQVar8,(QPainter *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QRect *)&local_d8;
  QRect::QRect(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,in_stack_fffffffffffffe6c,aheight)
  ;
  QRect::center(in_stack_fffffffffffffe90);
  QRect::moveCenter((QRect *)pQVar8,(QPoint *)in_stack_fffffffffffffe80);
  QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe6c,aheight));
  this_02 = (QPixmap *)&local_b8;
  QPainter::drawPixmap((QPainter *)pQVar8,in_RDX,(QPixmap *)this_01);
  QRenderRule::~QRenderRule(this_00);
  QPixmap::~QPixmap(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::renderMenuItemIcon(const QStyleOptionMenuItem *mi, QPainter *p, const QWidget *w,
                                          const QRect &rect, QRenderRule &subRule) const
{
    const QIcon::Mode mode = mi->state & QStyle::State_Enabled
                           ? (mi->state & QStyle::State_Selected ? QIcon::Active : QIcon::Normal)
                           : QIcon::Disabled;
    const bool checked = mi->checkType != QStyleOptionMenuItem::NotCheckable && mi->checked;
    const auto iconSize = pixelMetric(PM_SmallIconSize, mi, w);
    const QSize sz(iconSize, iconSize);
    const QPixmap pixmap(mi->icon.pixmap(sz, QStyleHelper::getDpr(p), mode,
                        checked ? QIcon::On : QIcon::Off));
    const int pixw = pixmap.width() / pixmap.devicePixelRatio();
    const int pixh = pixmap.height() / pixmap.devicePixelRatio();
    QRenderRule iconRule = renderRule(w, mi, PseudoElement_MenuIcon);
    if (!iconRule.hasGeometry()) {
        iconRule.geo = new QStyleSheetGeometryData(pixw, pixh, pixw, pixh, -1, -1);
    } else {
        iconRule.geo->width = pixw;
        iconRule.geo->height = pixh;
    }
    QRect iconRect = positionRect(w, subRule, iconRule, PseudoElement_MenuIcon, rect, mi->direction);
    if (mi->direction == Qt::LeftToRight)
        iconRect.moveLeft(iconRect.left());
    else
        iconRect.moveRight(iconRect.right());
    iconRule.drawRule(p, iconRect);
    QRect pmr(0, 0, pixw, pixh);
    pmr.moveCenter(iconRect.center());
    p->drawPixmap(pmr.topLeft(), pixmap);
}